

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction
          (ConversionStream *this,Char *FuncName,bool *bTakesInputPatch)

{
  TokenListType *this_00;
  StorageQualifier SVar1;
  int iVar2;
  int iVar3;
  ShaderParameterInfo *pSVar4;
  ShaderParameterInfo *pSVar5;
  HLSL2GLSLConverterImpl *pHVar6;
  iterator iVar7;
  pointer __position;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> __position_00;
  pointer pSVar8;
  bool bVar9;
  uint uVar10;
  char (*pacVar11) [32];
  ostream *poVar12;
  pointer pSVar13;
  ShaderParameterInfo *pSVar14;
  const_iterator cVar15;
  uint uVar16;
  char (*in_RCX) [32];
  iterator iVar17;
  ShaderParameterInfo *NextMember;
  char *pcVar18;
  char cVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  ConversionStream *pCVar20;
  bool bVar21;
  bool bIsVoid;
  pointer local_530;
  iterator Token;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  allocator local_4e9;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_4c0;
  String Prologue;
  iterator EntryPointToken;
  char *EntryPoint;
  string msg_1;
  iterator ArgsListEndToken;
  Char *FuncName_local;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  Params;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  stringstream PrologueSS;
  ostream local_330 [376];
  stringstream ReturnHandlerSS;
  ostream local_1a8 [376];
  
  this_00 = &this->m_Tokens;
  Token._M_node =
       (this->m_Tokens).
       super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  iVar2 = *(int *)&Token._M_node[1]._M_next;
  bVar21 = iVar2 == 0x133;
  if (bVar21) {
    Token._M_node = (Token._M_node)->_M_next;
  }
  pacVar11 = (char (*) [32])(ulong)bVar21;
  EntryPointToken._M_node = (_List_node_base *)this_00;
  FuncName_local = FuncName;
  while (iVar7._M_node = Token._M_node, uVar10 = (uint)pacVar11,
        iVar17._M_node = (_List_node_base *)this_00, uVar16 = uVar10,
        Token._M_node != (_List_node_base *)this_00) {
    iVar3 = *(int *)&Token._M_node[1]._M_next;
    if (iVar3 == 0x134) {
      uVar16 = uVar10 - 1;
      pacVar11 = (char (*) [32])(ulong)uVar16;
      in_RCX = pacVar11;
      iVar17._M_node = Token._M_node;
      if ((int)(uint)bVar21 < (int)uVar10) goto LAB_001cafdf;
      break;
    }
    if (iVar3 == 0x133) {
      uVar10 = uVar10 + 1;
LAB_001cafa0:
      pacVar11 = (char (*) [32])(ulong)uVar10;
LAB_001cafdf:
      in_RCX = pacVar11;
      Token._M_node = (iVar7._M_node)->_M_next;
    }
    else {
      if (uVar10 != 0) goto LAB_001cafa0;
      if (iVar3 != 0x13b) goto LAB_001cafdf;
      bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &Token._M_node[1]._M_prev,FuncName);
      pacVar11 = (char (*) [32])0x0;
      if (!bVar9) goto LAB_001cafdf;
      pacVar11 = (char (*) [32])0x0;
      in_RCX = pacVar11;
      Token._M_node = (_List_node_base *)this_00;
      EntryPointToken._M_node = iVar7._M_node;
    }
  }
  if (iVar2 == 0x133) {
    if (iVar17._M_node == (_List_node_base *)this_00) {
      FormatString<char[38]>
                ((string *)&PrologueSS,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)&ReturnHandlerSS,this,&Token,4);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&PrologueSS;
      in_RCX = (char (*) [32])0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,in_R8,(char (*) [2])0x2c8293,(String *)&ReturnHandlerSS);
      std::__cxx11::string::~string((string *)&ReturnHandlerSS);
      std::__cxx11::string::~string((string *)&PrologueSS);
    }
    if (*(int *)&Token._M_node[1]._M_next == 0x134) goto LAB_001cb154;
    FormatString<char[26],char[32]>
              ((string *)&PrologueSS,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == ClosingParenType",in_RCX);
    DebugAssertionFailed
              (_PrologueSS,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd1f);
  }
  else {
    if (uVar16 == 0) goto LAB_001cb154;
    FormatString<char[20]>((string *)&PrologueSS,(char (*) [20])"Unbalanced brackets");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&ReturnHandlerSS,this,&Token,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&PrologueSS;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd23,in_R8,(char (*) [2])0x2c8293,(String *)&ReturnHandlerSS);
    std::__cxx11::string::~string((string *)&ReturnHandlerSS);
  }
  std::__cxx11::string::~string((string *)&PrologueSS);
LAB_001cb154:
  if (EntryPointToken._M_node == (_List_node_base *)this_00) {
    ReturnHandlerSS = (stringstream)0x22;
    FormatString<char[47],char_const*,char>
              ((string *)&PrologueSS,(Diligent *)"Unable to find hull shader constant function \"",
               (char (*) [47])&FuncName_local,(char **)&ReturnHandlerSS,(char *)in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&ReturnHandlerSS,this,&EntryPointToken,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&PrologueSS;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd3a,in_R8,(char (*) [2])0x2c8293,(String *)&ReturnHandlerSS);
    std::__cxx11::string::~string((string *)&ReturnHandlerSS);
    std::__cxx11::string::~string((string *)&PrologueSS);
  }
  EntryPoint = (char *)EntryPointToken._M_node[1]._M_prev;
  local_4c0._M_node = (EntryPointToken._M_node)->_M_prev;
  if (local_4c0._M_node ==
      (this_00->
      super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
      )._M_impl._M_node.super__List_node_base._M_next) {
    FormatString<char[11],std::__cxx11::string,char[21]>
              ((string *)&PrologueSS,(Diligent *)"Function \"",
               (char (*) [11])&EntryPointToken._M_node[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\" misses return type",(char (*) [21])in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&ReturnHandlerSS,this,&local_4c0,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd42,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &PrologueSS,(char (*) [2])0x2c8293,(String *)&ReturnHandlerSS);
    std::__cxx11::string::~string((string *)&ReturnHandlerSS);
    std::__cxx11::string::~string((string *)&PrologueSS);
  }
  Params.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Params.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Params.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bIsVoid = false;
  ArgsListEndToken._M_node = local_4c0._M_node;
  ProcessFunctionParameters(this,&ArgsListEndToken,&Params,&bIsVoid);
  std::__cxx11::stringstream::stringstream((stringstream *)&PrologueSS);
  std::__cxx11::stringstream::stringstream((stringstream *)&ReturnHandlerSS);
  poVar12 = std::operator<<(local_1a8,"#define ");
  poVar12 = std::operator<<(poVar12,"_CONST_FUNC_RETURN_");
  pcVar18 = "(_RET_VAL_)";
  if (bIsVoid != false) {
    pcVar18 = "";
  }
  poVar12 = std::operator<<(poVar12,pcVar18);
  std::operator<<(poVar12," {\\\n");
  pSVar8 = Params.
           super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *bTakesInputPatch = false;
  pSVar13 = Params.
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pSVar13 == pSVar8) {
      std::operator<<(local_1a8,"return;}\n");
      __position_00._M_node = local_4c0._M_node;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string
                ((string *)&local_3a0,Prologue._M_dataplus._M_p,(allocator *)&MemberStack);
      std::__cxx11::string::string
                ((string *)&local_3c0,(char *)local_4c0._M_node[3]._M_prev,
                 (allocator *)&MemberItStack);
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
      ;
      Parsing::HLSLTokenInfo::HLSLTokenInfo
                ((HLSLTokenInfo *)&msg_1,TextBlock,&local_3a0,&local_3c0,0xffffffffffffffff);
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                (this_00,(const_iterator)__position_00._M_node,(HLSLTokenInfo *)&msg_1);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg_1);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&Prologue);
      std::__cxx11::string::assign((char *)&local_4c0._M_node[3]._M_prev);
      std::__cxx11::stringbuf::str();
      Token._M_node = (ArgsListEndToken._M_node)->_M_next;
      if (Token._M_node == (_List_node_base *)this_00) {
        FormatString<char[55],char_const*,char[3]>
                  (&msg_1,(Diligent *)"Unexpected end of file while looking for the body of \"",
                   (char (*) [55])&EntryPoint,(char **)0x2dfa85,(char (*) [3])Args);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  ((String *)&MemberStack,this,&Token,4);
        Args = &msg_1;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessHullShaderConstantFunction",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xd93,Args,(char (*) [2])0x2c8293,(String *)&MemberStack);
        std::__cxx11::string::~string((string *)&MemberStack);
        std::__cxx11::string::~string((string *)&msg_1);
      }
      if (*(int *)&Token._M_node[1]._M_next != 0x133) {
        FormatString<char[13]>(&msg_1,(char (*) [13])"\'{\' expected");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  ((String *)&MemberStack,this,&Token,4);
        Args = &msg_1;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessHullShaderConstantFunction",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xd94,Args,(char (*) [2])0x2c8293,(String *)&MemberStack);
        std::__cxx11::string::~string((string *)&MemberStack);
        std::__cxx11::string::~string((string *)&msg_1);
      }
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(Token._M_node)->_M_next;
      if ((TokenListType *)
          MemberItStack.
          super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == this_00) {
        FormatString<char[55],char_const*,char[3]>
                  (&msg_1,(Diligent *)"Unexpected end of file while looking for the body of \"",
                   (char (*) [55])&EntryPoint,(char **)0x2dfa85,(char (*) [3])Args);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  ((String *)&MemberStack,this,
                   (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&MemberItStack,4);
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessHullShaderConstantFunction",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xd9c,&msg_1,(char (*) [2])0x2c8293,(String *)&MemberStack);
        std::__cxx11::string::~string((string *)&MemberStack);
        std::__cxx11::string::~string((string *)&msg_1);
      }
      __position = MemberItStack.
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string
                ((string *)&local_3e0,Prologue._M_dataplus._M_p,(allocator *)&MemberStack);
      std::__cxx11::string::string((string *)&local_400,"\n",&local_4e9);
      Parsing::HLSLTokenInfo::HLSLTokenInfo
                ((HLSLTokenInfo *)&msg_1,TextBlock,&local_3e0,&local_400,0xffffffffffffffff);
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                (this_00,(const_iterator)__position,(HLSLTokenInfo *)&msg_1);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg_1);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_3e0);
      ProcessReturnStatements(this,&Token,bIsVoid,EntryPoint,"_CONST_FUNC_RETURN_");
      std::__cxx11::string::~string((string *)&Prologue);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ReturnHandlerSS);
      std::__cxx11::stringstream::~stringstream((stringstream *)&PrologueSS);
      std::
      vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
      ::~vector(&Params);
      return;
    }
    SVar1 = pSVar13->storageQualifier;
    local_530 = pSVar13;
    if ((SVar1 == Ret) || (SVar1 == Out)) {
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      msg_1._M_dataplus._M_p = (pointer)pSVar13;
      std::
      vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
      ::emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  *)&MemberStack,(ShaderParameterInfo **)&msg_1);
      msg_1._M_dataplus._M_p =
           (pointer)(pSVar13->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
      ::
      emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  *)&MemberItStack,
                 (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)&msg_1);
      if ((pSVar13->storageQualifier != Ret) &&
         (((local_530->GSAttribs).PrimType == Undefined &&
          ((local_530->HSAttribs).PatchType == Undefined)))) {
        poVar12 = std::operator<<(local_330,"    ");
        poVar12 = std::operator<<(poVar12,(local_530->Type)._M_dataplus._M_p);
        poVar12 = std::operator<<(poVar12,' ');
        std::operator<<(poVar12,(local_530->Name)._M_dataplus._M_p);
        if ((local_530->ArraySize)._M_string_length != 0) {
          poVar12 = std::operator<<(local_330,'[');
          poVar12 = std::operator<<(poVar12,(string *)&local_530->ArraySize);
          std::operator<<(poVar12,']');
        }
        std::operator<<(local_330,";\n");
      }
      while (MemberStack.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             MemberStack.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        pSVar4 = MemberStack.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1];
        pSVar5 = (pSVar4->members).
                 super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar14 = (pSVar4->members).
                  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pSVar5 == pSVar14) {
          if (MemberItStack.
              super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current != pSVar5) {
            FormatString<char[26],char[49]>
                      (&msg_1,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                       (char (*) [49])pSVar5);
            DebugAssertionFailed
                      (msg_1._M_dataplus._M_p,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb19);
            std::__cxx11::string::~string((string *)&msg_1);
          }
          if ((pSVar4->Semantic)._M_string_length == 0) {
            LogError<true,char[36],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar4->Name,
                       (char (*) [2])0x2dfbac);
          }
          Prologue._M_dataplus._M_p = (pointer)&Prologue.field_2;
          Prologue._M_string_length = 0;
          Prologue.field_2._M_local_buf[0] = '\0';
          pHVar6 = this->m_Converter;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&msg_1,(pSVar4->Semantic)._M_dataplus._M_p,false);
          pCVar20 = (ConversionStream *)&msg_1;
          cVar15 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[1]._M_h,
                          (key_type *)&msg_1);
          HashMapStringKey::Clear((HashMapStringKey *)&msg_1);
          if (cVar15.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            pCVar20 = (ConversionStream *)
                      ((long)cVar15.
                             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 0x18);
            std::__cxx11::string::_M_assign((string *)&Prologue);
          }
          pcVar18 = "";
          if (pSVar4->storageQualifier == Ret) {
            pcVar18 = "_RET_VAL_";
          }
          BuildParameterName_abi_cxx11_((String *)&msg_1,pCVar20,&MemberStack,'.',"",pcVar18,"");
          if (Prologue._M_string_length == 0) {
            LogError<true,char[120],std::__cxx11::string,char[18],std::__cxx11::string,char[19]>
                      (false,"operator()",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xd82,(char (*) [120])
                              "Supported output semantics of a hull shader constant function are \"SV_TessFactor\" and \"SV_InsideTessFactor\".\nVariable \""
                       ,&pSVar4->Name,(char (*) [18])"\" with semantic \"",&pSVar4->Semantic,
                       (char (*) [19])"\" is not supported");
          }
          poVar12 = std::operator<<(local_1a8,(string *)&Prologue);
          poVar12 = std::operator<<(poVar12,'(');
          poVar12 = std::operator<<(poVar12,(string *)&msg_1);
          std::operator<<(poVar12,");\\\n");
          std::__cxx11::string::~string((string *)&msg_1);
          MemberStack.
          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberStack.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          MemberItStack.
          super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberItStack.
               super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          std::__cxx11::string::~string((string *)&Prologue);
        }
        else {
          if ((pSVar4->Semantic)._M_string_length != 0) {
            LogError<true,char[35],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar4->Name,
                       (char (*) [2])0x2dfbac);
            pSVar14 = (pSVar4->members).
                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          pSVar4 = MemberItStack.
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current;
          if (pSVar4 == pSVar14) {
            MemberStack.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberStack.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberItStack.
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          else {
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current = pSVar4 + 1;
            msg_1._M_dataplus._M_p = (pointer)pSVar4;
            std::
            vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
            ::
            emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                      ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                        *)&MemberStack,(ShaderParameterInfo **)&msg_1);
            msg_1._M_dataplus._M_p =
                 (pointer)(pSVar4->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
            ::
            emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                      ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                        *)&MemberItStack,
                       (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)&msg_1);
          }
        }
      }
LAB_001cb841:
      std::
      _Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ::~_Vector_base(&MemberItStack.
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                     );
      std::
      _Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ::~_Vector_base(&MemberStack.
                       super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     );
    }
    else if (SVar1 == In) {
      if ((pSVar13->HSAttribs).PatchType != InputPatch) {
        MemberStack.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        MemberStack.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        MemberStack.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        MemberItStack.
        super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        MemberItStack.
        super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        MemberItStack.
        super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        msg_1._M_dataplus._M_p = (pointer)pSVar13;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&MemberStack,(ShaderParameterInfo **)&msg_1);
        msg_1._M_dataplus._M_p =
             (pointer)(pSVar13->members).
                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
        ::
        emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                  ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                    *)&MemberItStack,
                   (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                    *)&msg_1);
        if (((pSVar13->storageQualifier != Ret) && ((local_530->GSAttribs).PrimType == Undefined))
           && ((local_530->HSAttribs).PatchType == Undefined)) {
          poVar12 = std::operator<<(local_330,"    ");
          poVar12 = std::operator<<(poVar12,(local_530->Type)._M_dataplus._M_p);
          poVar12 = std::operator<<(poVar12,' ');
          std::operator<<(poVar12,(local_530->Name)._M_dataplus._M_p);
          if ((local_530->ArraySize)._M_string_length != 0) {
            poVar12 = std::operator<<(local_330,'[');
            poVar12 = std::operator<<(poVar12,(string *)&local_530->ArraySize);
            std::operator<<(poVar12,']');
          }
          std::operator<<(local_330,";\n");
        }
        while (MemberStack.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               MemberStack.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
          pSVar4 = MemberStack.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
          pSVar5 = (pSVar4->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar14 = (pSVar4->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar5 == pSVar14) {
            if (MemberItStack.
                super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current != pSVar5) {
              FormatString<char[26],char[49]>
                        (&msg_1,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])pSVar5);
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              std::__cxx11::string::~string((string *)&msg_1);
            }
            if ((pSVar4->Semantic)._M_string_length == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar4->Name,
                         (char (*) [2])0x2dfbac);
            }
            Prologue._M_dataplus._M_p = (pointer)&Prologue.field_2;
            Prologue._M_string_length = 0;
            Prologue.field_2._M_local_buf[0] = '\0';
            pHVar6 = this->m_Converter;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)&msg_1,(pSVar4->Semantic)._M_dataplus._M_p,false);
            pCVar20 = (ConversionStream *)&msg_1;
            cVar15 = std::
                     _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)((pHVar6->m_HLSLSemanticToGLSLVar)._M_elems + 3),(key_type *)&msg_1);
            HashMapStringKey::Clear((HashMapStringKey *)&msg_1);
            if (cVar15.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                ._M_cur != (__node_type *)0x0) {
              pCVar20 = (ConversionStream *)
                        ((long)cVar15.
                               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x18);
              std::__cxx11::string::_M_assign((string *)&Prologue);
            }
            BuildParameterName_abi_cxx11_((String *)&msg_1,pCVar20,&MemberStack,'.',"","","");
            if (Prologue._M_string_length == 0) {
              LogError<true,char[115],std::__cxx11::string,char[18],std::__cxx11::string,char[19]>
                        (false,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xd6f,(char (*) [115])
                                "Supported inputs to a hull shader constant function are \"InputPatch<>\" and variables with SV_ semantic.\nVariable \""
                         ,&pSVar4->Name,(char (*) [18])"\" with semantic \"",&pSVar4->Semantic,
                         (char (*) [19])"\" is not supported");
            }
            poVar12 = std::operator<<(local_330,"    ");
            poVar12 = std::operator<<(poVar12,(string *)&Prologue);
            poVar12 = std::operator<<(poVar12,'(');
            poVar12 = std::operator<<(poVar12,(string *)&msg_1);
            std::operator<<(poVar12,");\n");
            std::__cxx11::string::~string((string *)&msg_1);
            MemberStack.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberStack.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberItStack.
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            std::__cxx11::string::~string((string *)&Prologue);
          }
          else {
            if ((pSVar4->Semantic)._M_string_length != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar4->Name,
                         (char (*) [2])0x2dfbac);
              pSVar14 = (pSVar4->members).
                        super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            pSVar4 = MemberItStack.
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current;
            if (pSVar4 == pSVar14) {
              MemberStack.
              super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   MemberStack.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              MemberItStack.
              super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   MemberItStack.
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
            }
            else {
              MemberItStack.
              super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current = pSVar4 + 1;
              msg_1._M_dataplus._M_p = (pointer)pSVar4;
              std::
              vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
              ::
              emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                        ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                          *)&MemberStack,(ShaderParameterInfo **)&msg_1);
              msg_1._M_dataplus._M_p =
                   (pointer)(pSVar4->members).
                            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              std::
              vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
              ::
              emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                        ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                          *)&MemberItStack,
                         (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                          *)&msg_1);
            }
          }
        }
        goto LAB_001cb841;
      }
      *bTakesInputPatch = true;
      std::__cxx11::string::string((string *)&Prologue,(string *)&pSVar13->Type);
      cVar19 = (char)&Prologue;
      std::__cxx11::string::push_back(cVar19);
      std::__cxx11::string::append((string *)&Prologue);
      std::__cxx11::string::push_back(cVar19);
      std::__cxx11::string::append((string *)&Prologue);
      std::__cxx11::string::push_back(cVar19);
      iVar7 = ArgsListEndToken;
      std::__cxx11::string::string
                ((string *)&local_360,Prologue._M_dataplus._M_p,(allocator *)&MemberStack);
      std::__cxx11::string::string((string *)&local_380,"",(allocator *)&MemberItStack);
      Parsing::HLSLTokenInfo::HLSLTokenInfo
                ((HLSLTokenInfo *)&msg_1,TextBlock,&local_360,&local_380,0xffffffffffffffff);
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                (this_00,(const_iterator)iVar7._M_node,(HLSLTokenInfo *)&msg_1);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg_1);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&Prologue);
    }
    pSVar13 = local_530 + 1;
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction(const Char* FuncName, bool& bTakesInputPatch)
{
    // Search for the function in the global scope
    auto EntryPointToken = m_Tokens.end();
    auto Token           = m_Tokens.begin();
    ProcessScope(
        Token, m_Tokens.end(), TokenType::OpenBrace, TokenType::ClosingBrace,
        [&](TokenListType::iterator& tkn, int ScopeDepth) //
        {
            if (ScopeDepth == 0 && tkn->Type == TokenType::Identifier && tkn->Literal == FuncName)
            {
                EntryPointToken = tkn;
                tkn             = m_Tokens.end();
            }
            else
                ++tkn;
        } //
    );
    VERIFY_PARSER_STATE(EntryPointToken, EntryPointToken != m_Tokens.end(), "Unable to find hull shader constant function \"", FuncName, '\"');
    const auto* EntryPoint = EntryPointToken->Literal.c_str();

    auto TypeToken = EntryPointToken;
    --TypeToken;
    // void ConstantHS( InputPatch<VSOutput, 1> p,
    // ^
    // TypeToken
    VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.begin(), "Function \"", EntryPointToken->Literal, "\" misses return type");

    std::vector<ShaderParameterInfo> Params;

    auto ArgsListEndToken = TypeToken;
    bool bIsVoid          = false;
    ProcessFunctionParameters(ArgsListEndToken, Params, bIsVoid);
    // HS_CONSTANT_DATA_OUTPUT ConstantHS( InputPatch<VSOutput, 1> p,
    //                                     uint BlockID : SV_PrimitiveID)
    //                                                                  ^
    //                                                       ArgsListEndToken

    std::stringstream PrologueSS, ReturnHandlerSS;
    const Char*       ReturnMacroName = "_CONST_FUNC_RETURN_";
    // Some GLES compilers cannot properly handle macros with empty argument lists, such as _CONST_FUNC_RETURN_().
    // Also, some compilers generate an error if there is no whitespace after the macro without arguments: _CONST_FUNC_RETURN_{
    ReturnHandlerSS << "#define " << ReturnMacroName << (bIsVoid ? "" : "(_RET_VAL_)") << " {\\\n";

    bTakesInputPatch = false;
    for (const auto& TopLevelParam : Params)
    {
        if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            if (TopLevelParam.HSAttribs.PatchType == ShaderParameterInfo::HSAttributes::InOutPatchType::InputPatch)
            {
                bTakesInputPatch = true;
                String Argument(TopLevelParam.Type);
                Argument.push_back(' ');
                Argument.append(TopLevelParam.Name);
                Argument.push_back('[');
                Argument.append(TopLevelParam.ArraySize);
                Argument.push_back(']');
                m_Tokens.insert(ArgsListEndToken, TokenInfo(TokenType::TextBlock, Argument.c_str()));
            }
            else
            {
                ProcessShaderArgument(
                    TopLevelParam, HSInd, InVar, PrologueSS,
                    [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                    {
                        String FullIndexedParamName = BuildParameterName(MemberStack, '.');
                        if (Getter.empty())
                        {
                            LOG_ERROR_AND_THROW("Supported inputs to a hull shader constant function are \"InputPatch<>\" and variables with SV_ semantic.\n"
                                                "Variable \"",
                                                Param.Name, "\" with semantic \"", Param.Semantic, "\" is not supported");
                        }
                        PrologueSS << "    " << Getter << '(' << FullIndexedParamName << ");\n";
                    } //
                );
            }
        }
        else if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                TopLevelParam, HSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String SrcParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (Setter.empty())
                    {
                        LOG_ERROR_AND_THROW("Supported output semantics of a hull shader constant function are \"SV_TessFactor\" and \"SV_InsideTessFactor\".\n"
                                            "Variable \"",
                                            Param.Name, "\" with semantic \"", Param.Semantic, "\" is not supported");
                    }

                    // A TCS can only ever write to the per-vertex output variable that corresponds to their invocation,
                    // so writes to per-vertex outputs must be of the form vertexTexCoord[gl_InvocationID]
                    ReturnHandlerSS << Setter << '(' << SrcParamName << ");\\\n";
                } //
            );
        }
    }
    ReturnHandlerSS << "return;}\n";
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, ReturnHandlerSS.str().c_str(), TypeToken->Delimiter.c_str()));
    TypeToken->Delimiter = "\n";

    String Prologue = PrologueSS.str();
    Token           = ArgsListEndToken;
    ++Token;
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file while looking for the body of \"", EntryPoint, "\".");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::OpenBrace, "\'{\' expected");

    auto FirstStatementToken = Token;
    ++FirstStatementToken;
    // void main ()
    // {
    //      int a;
    //      ^
    VERIFY_PARSER_STATE(FirstStatementToken, FirstStatementToken != m_Tokens.end(), "Unexpected end of file while looking for the body of \"", EntryPoint, "\".");

    // Insert prologue before the first token
    m_Tokens.insert(FirstStatementToken, TokenInfo(TokenType::TextBlock, Prologue.c_str(), "\n"));

    ProcessReturnStatements(Token, bIsVoid, EntryPoint, ReturnMacroName);
}